

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_filter.cpp
# Opt level: O3

void __thiscall NJamSpell::TBloomFilter::Impl::Dump(Impl *this,ostream *out)

{
  pointer puVar1;
  pointer puVar2;
  uint *obj;
  pointer puVar3;
  pointer puVar4;
  int local_48;
  undefined4 local_44;
  uint32_t size_1;
  uint32_t size;
  unsigned_long_long *local_38;
  
  local_44 = (undefined4)
             ((ulong)((long)(this->super_bloom_filter).salt_.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(this->super_bloom_filter).salt_.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2);
  std::ostream::write((char *)out,(long)&local_44);
  puVar1 = (this->super_bloom_filter).salt_.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar3 = (this->super_bloom_filter).salt_.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    std::ostream::write((char *)out,(long)puVar3);
  }
  local_48 = *(int *)&(this->super_bloom_filter).bit_table_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
             *(int *)&(this->super_bloom_filter).bit_table_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start;
  std::ostream::write((char *)out,(long)&local_48);
  puVar2 = (this->super_bloom_filter).bit_table_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar4 = (this->super_bloom_filter).bit_table_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start; puVar4 != puVar2; puVar4 = puVar4 + 1) {
    std::ostream::write((char *)out,(long)puVar4);
  }
  _size_1 = &(this->super_bloom_filter).desired_false_positive_probability_;
  local_38 = &(this->super_bloom_filter).random_seed_;
  std::ostream::write((char *)out,(long)&(this->super_bloom_filter).salt_count_);
  std::ostream::write((char *)out,(long)&(this->super_bloom_filter).table_size_);
  std::ostream::write((char *)out,(long)&(this->super_bloom_filter).projected_element_count_);
  std::ostream::write((char *)out,(long)&(this->super_bloom_filter).inserted_element_count_);
  std::ostream::write((char *)out,(long)local_38);
  std::ostream::write((char *)out,(long)_size_1);
  return;
}

Assistant:

void Dump(std::ostream& out) const {
        NHandyPack::Dump(out, salt_, bit_table_, salt_count_, table_size_,
                        projected_element_count_, inserted_element_count_,
                        random_seed_, desired_false_positive_probability_);
    }